

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_false>::shelter_
          (DaTrie<true,_false,_false> *this,uint32_t base,Edge *edge,Query *query)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  byte *pbVar4;
  reference pvVar5;
  Edge *in_RDX;
  uint in_ESI;
  Edge *in_RDI;
  Edge *unaff_retaddr;
  uint32_t in_stack_00000008;
  uint32_t in_stack_0000000c;
  DaTrie<true,_false,_false> *in_stack_00000010;
  uint32_t _base;
  uint32_t node_pos;
  uint32_t child_pos;
  uint8_t label;
  uint8_t *__end2;
  uint8_t *__begin2;
  Edge *__range2;
  uint32_t ng_block;
  Edge _edge;
  undefined4 in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe8c;
  uint32_t in_stack_fffffffffffffe9c;
  Edge *in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea8;
  byte *local_140;
  Edge local_128;
  Edge *local_18;
  uint local_c;
  Edge *query_00;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  query_00 = in_RDI;
  Edge::Edge(&local_128);
  local_140 = Edge::begin(local_18);
  pbVar4 = Edge::end(local_18);
  for (; local_140 != pbVar4; local_140 = local_140 + 1) {
    uVar2 = local_c ^ *local_140;
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
    bVar1 = Bc::is_fixed(pvVar5);
    if (bVar1) {
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
      uVar3 = Bc::check(pvVar5);
      edge_((DaTrie<true,_false,_false> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_RDI
            ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      in_stack_fffffffffffffe8c =
           xcheck_((DaTrie<true,_false,_false> *)CONCAT44(uVar3,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                   (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RDI);
      in_stack_fffffffffffffea8 = in_stack_fffffffffffffe8c;
      move_(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,(Query *)query_00);
    }
  }
  Edge::~Edge(&local_128);
  return;
}

Assistant:

void shelter_(uint32_t base, const Edge& edge, Query& query) {
    Edge _edge;
    auto ng_block = base / BLOCK_SIZE;

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (bc_[child_pos].is_fixed()) {
        auto node_pos = bc_[child_pos].check();
        edge_(node_pos, _edge);

        auto _base = xcheck_(_edge, ng_block, blocks_);
        move_(node_pos, _base, _edge, query);
      }
    }
  }